

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IniTest.cpp
# Opt level: O2

void __thiscall TApp_IniFlagConvertFailure_Test::TestBody(TApp_IniFlagConvertFailure_Test *this)

{
  App *this_00;
  bool bVar1;
  ostream *poVar2;
  AssertHelper AStack_2f8;
  TempFile tmpini;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  ofstream out;
  
  std::__cxx11::string::string((string *)&local_230,"TestIniTmp.ini",(allocator *)&out);
  TempFile::TempFile(&tmpini,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_250,"--flag",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_270,"",(allocator *)&AStack_2f8);
  this_00 = &(this->super_TApp).app;
  CLI::App::add_flag(this_00,&local_250,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string((string *)&local_290,"--config",(allocator *)&out);
  std::__cxx11::string::string((string *)&local_2b0,(string *)&tmpini);
  std::__cxx11::string::string((string *)&local_2d0,"Read an ini file",(allocator *)&AStack_2f8);
  CLI::App::set_config(this_00,&local_290,&local_2b0,&local_2d0,false);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_290);
  std::ofstream::ofstream(&out,(string *)&tmpini,_S_out);
  poVar2 = std::operator<<((ostream *)&out,"flag=moobook");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ofstream::~ofstream(&out);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    TApp::run(&this->super_TApp);
  }
  testing::Message::Message((Message *)&out);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_2f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/IniTest.cpp"
             ,0x1cc,
             "Expected: run() throws an exception of type CLI::ConversionError.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_2f8,(Message *)&out);
  testing::internal::AssertHelper::~AssertHelper(&AStack_2f8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&out);
  TempFile::~TempFile(&tmpini);
  return;
}

Assistant:

TEST_F(TApp, IniFlagConvertFailure) {

    TempFile tmpini{"TestIniTmp.ini"};

    app.add_flag("--flag");
    app.set_config("--config", tmpini);

    {
        std::ofstream out{tmpini};
        out << "flag=moobook" << std::endl;
    }

    EXPECT_THROW(run(), CLI::ConversionError);
}